

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_1in_1out.c
# Opt level: O3

ErrorNumber test_func_1in_1out(TA_History *history)

{
  int startIdx;
  int endIdx;
  TA_Real *pTVar1;
  TA_TestId TVar2;
  TA_RetCode TVar3;
  TA_RetCode TVar4;
  ErrorNumber EVar5;
  int *piVar6;
  TestBuffer *pTVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  TA_History *pTVar12;
  TA_FuncUnstId unstId;
  uint integerTolerance;
  TA_Test_conflict *pTVar13;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  ulong local_78;
  int local_6c;
  TA_Test_conflict *local_68;
  TA_Real *local_60;
  TA_History *local_58;
  TA_Real *local_50;
  long local_48;
  TestBuffer *local_40;
  TestBuffer *local_38;
  
  local_38 = (TestBuffer *)&history->close;
  local_40 = gBuffer + 1;
  uVar10 = 0;
  local_58 = history;
  do {
    pTVar12 = local_58;
    TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
    if ((int)pTVar12->nbBars < tableTest[uVar10].expectedNbElement) {
      printf("Failed Bad Parameter for Test #%d (%d,%d)\n",uVar10 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    pTVar13 = tableTest + uVar10;
    local_78 = uVar10;
    clearAllBuffers();
    setInputBuffer(0,pTVar12->close,pTVar12->nbBars);
    TVar2 = tableTest[uVar10].theFunction;
    pTVar7 = local_38;
    if (TVar2 < TA_ACCBANDS_TEST) {
      TA_MEDPRICE(0,pTVar12->nbBars - 1,pTVar12->high,pTVar12->low,&outBegIdx,&outNbElement,
                  gBuffer[0].in);
      TA_MEDPRICE(0,pTVar12->nbBars - 1,pTVar12->high,pTVar12->low,&outBegIdx,&outNbElement,
                  gBuffer[1].in);
      TVar2 = tableTest[uVar10].theFunction;
      pTVar7 = local_40;
    }
    local_50 = pTVar7->in;
    startIdx = tableTest[uVar10].startIdx;
    endIdx = tableTest[uVar10].endIdx;
    iVar8 = endIdx - startIdx;
    switch(TVar2) {
    case TA_ANY_MA_TEST:
      TVar3 = TA_HT_DCPERIOD(startIdx,endIdx,gBuffer[0].in,&outBegIdx,&outNbElement,gBuffer[0].out0)
      ;
      break;
    case TA_AD_TEST:
      TVar3 = TA_HT_DCPHASE(startIdx,endIdx,gBuffer[0].in,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    case TA_ADOSC_3_10_TEST:
      TVar3 = TA_HT_TRENDLINE(startIdx,endIdx,gBuffer[0].in,&outBegIdx,&outNbElement,gBuffer[0].out0
                             );
      break;
    case TA_ADOSC_5_2_TEST:
      lVar9 = (long)iVar8;
      local_6c = iVar8;
      piVar6 = (int *)malloc(lVar9 * 4 + 0xc);
      *piVar6 = -0x54540124;
      piVar6[lVar9 + 2] = -0x10543201;
      local_48 = lVar9;
      TVar4 = TA_HT_TRENDMODE(startIdx,endIdx,gBuffer[0].in,&outBegIdx,&outNbElement,piVar6 + 1);
      pTVar1 = gBuffer[0].out0;
      TVar3 = 0x1412;
      if (((*piVar6 == -0x54540124) && (TVar3 = 0x1413, piVar6[local_48 + 2] == -0x10543201)) &&
         (TVar3 = TVar4, 0 < (long)outNbElement)) {
        lVar9 = 0;
        do {
          pTVar1[lVar9] = (double)piVar6[lVar9 + 1];
          lVar9 = lVar9 + 1;
        } while (outNbElement != lVar9);
      }
      free(piVar6);
      pTVar12 = local_58;
      iVar8 = local_6c;
      break;
    case TA_ACCBANDS_TEST:
      TVar3 = TA_SIN(startIdx,endIdx,gBuffer[0].in,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    default:
      TVar3 = 0x140d;
    }
    EVar5 = checkDataSame(gBuffer[0].in,local_50,pTVar12->nbBars);
    uVar11 = local_78;
    if (EVar5 != TA_TEST_PASS) goto LAB_001145b1;
    EVar5 = checkExpectedValue(gBuffer[0].out0,TVar3,tableTest[uVar10].expectedRetCode,outBegIdx,
                               tableTest[uVar10].expectedBegIdx,outNbElement,
                               tableTest[uVar10].expectedNbElement,
                               tableTest[uVar10].oneOfTheExpectedOutReal0,
                               tableTest[uVar10].oneOfTheExpectedOutRealIndex0);
    uVar11 = local_78;
    if (EVar5 != TA_TEST_PASS) {
LAB_001145a1:
      printf("Fail for output id=%d\n",0);
      goto LAB_001145b1;
    }
    outNbElement = 0;
    outBegIdx = 0;
    switch(tableTest[uVar10].theFunction) {
    case TA_ANY_MA_TEST:
      TVar3 = TA_HT_DCPERIOD(tableTest[uVar10].startIdx,tableTest[uVar10].endIdx,gBuffer[0].in,
                             &outBegIdx,&outNbElement,gBuffer[0].in);
      break;
    case TA_AD_TEST:
      TVar3 = TA_HT_DCPHASE(tableTest[uVar10].startIdx,tableTest[uVar10].endIdx,gBuffer[0].in,
                            &outBegIdx,&outNbElement,gBuffer[0].in);
      break;
    case TA_ADOSC_3_10_TEST:
      TVar3 = TA_HT_TRENDLINE(tableTest[uVar10].startIdx,tableTest[uVar10].endIdx,gBuffer[0].in,
                              &outBegIdx,&outNbElement,gBuffer[0].in);
      break;
    case TA_ADOSC_5_2_TEST:
      lVar9 = (long)iVar8;
      piVar6 = (int *)malloc(lVar9 * 4 + 0xc);
      *piVar6 = -0x54540124;
      piVar6[lVar9 + 2] = -0x10543201;
      TVar4 = TA_HT_TRENDMODE(tableTest[uVar10].startIdx,tableTest[uVar10].endIdx,gBuffer[0].in,
                              &outBegIdx,&outNbElement,piVar6 + 1);
      pTVar1 = gBuffer[0].in;
      TVar3 = 0x1412;
      if (((*piVar6 == -0x54540124) && (TVar3 = 0x1413, piVar6[lVar9 + 2] == -0x10543201)) &&
         (TVar3 = TVar4, 0 < (long)outNbElement)) {
        lVar9 = 0;
        do {
          pTVar1[lVar9] = (double)piVar6[lVar9 + 1];
          lVar9 = lVar9 + 1;
        } while (outNbElement != lVar9);
      }
      free(piVar6);
      break;
    case TA_ACCBANDS_TEST:
      TVar3 = TA_SIN(tableTest[uVar10].startIdx,tableTest[uVar10].endIdx,gBuffer[0].in,&outBegIdx,
                     &outNbElement,gBuffer[0].in);
      break;
    default:
      TVar3 = 0x140e;
    }
    EVar5 = checkSameContent(gBuffer[0].out0,gBuffer[0].in);
    uVar11 = local_78;
    if (EVar5 != TA_TEST_PASS) goto LAB_001145b1;
    EVar5 = checkExpectedValue(gBuffer[0].in,TVar3,tableTest[uVar10].expectedRetCode,outBegIdx,
                               tableTest[uVar10].expectedBegIdx,outNbElement,
                               tableTest[uVar10].expectedNbElement,
                               tableTest[uVar10].oneOfTheExpectedOutReal0,
                               tableTest[uVar10].oneOfTheExpectedOutRealIndex0);
    if (EVar5 != TA_TEST_PASS) goto LAB_001145a1;
    local_60 = local_50;
    local_68 = pTVar13;
    if (pTVar13->doRangeTestFlag != 0) {
      switch(tableTest[uVar10].theFunction) {
      case TA_ANY_MA_TEST:
        unstId = TA_FUNC_UNST_HT_DCPERIOD;
        break;
      case TA_AD_TEST:
        unstId = TA_FUNC_UNST_HT_DCPHASE;
        integerTolerance = 0x168;
        goto LAB_0011453e;
      case TA_ADOSC_3_10_TEST:
        unstId = TA_FUNC_UNST_HT_TRENDLINE;
        break;
      case TA_ADOSC_5_2_TEST:
        unstId = TA_FUNC_UNST_HT_TRENDMODE;
        break;
      default:
        unstId = TA_FUNC_UNST_NONE;
      }
      integerTolerance = 0;
LAB_0011453e:
      EVar5 = doRangeTest(rangeTestFunction,unstId,&local_68,1,integerTolerance);
      if (EVar5 != TA_TEST_PASS) {
LAB_001145b1:
        printf("Failed Test #%d (Code=%d)\n",uVar11 & 0xffffffff,(ulong)EVar5);
        return EVar5;
      }
    }
    uVar10 = uVar11 + 1;
    if (uVar10 == 0xe) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
  } while( true );
}

Assistant:

ErrorNumber test_func_1in_1out( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   for( i=0; i < NB_TEST; i++ )
   {
      /* Re-initialize all the unstable period to zero. */
      TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "Failed Bad Parameter for Test #%d (%d,%d)\n",
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "Failed Test #%d (Code=%d)\n", i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}